

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndsWithTest.cpp
# Opt level: O2

void __thiscall oout::EndsWithTest::EndsWithTest(EndsWithTest *this,string *a,string *b)

{
  undefined1 local_48 [40];
  
  std::make_shared<oout::StringText,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  local_48._16_8_ = local_48._0_8_;
  local_48._24_8_ = local_48._8_8_;
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = 0;
  EndsWithTest(this,(shared_ptr<const_oout::Text> *)(local_48 + 0x10),b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return;
}

Assistant:

EndsWithTest::EndsWithTest(const string &a, const string &b)
	: EndsWithTest(make_shared<StringText>(a), b)
{
}